

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

ssize_t __thiscall
httplib::ClientImpl::send(ClientImpl *this,int __fd,void *__buf,size_t __n,int __flags)

{
  bool bVar1;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  ulong uVar2;
  undefined4 in_register_00000034;
  
  std::recursive_mutex::lock(&this->request_mutex_);
  bVar1 = send_(this,(Request *)CONCAT44(in_register_00000034,__fd),(Response *)__buf,(Error *)__n);
  uVar2 = CONCAT71(extraout_var,bVar1) & 0xffffffff;
  if (*(int *)__n == 0xe) {
    if ((char)uVar2 != '\0') {
      __assert_fail("!ret",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/nickware44[P]interference/3rdparty/httplib.h"
                    ,0x18f4,"bool httplib::ClientImpl::send(Request &, Response &, Error &)");
    }
    bVar1 = send_(this,(Request *)CONCAT44(in_register_00000034,__fd),(Response *)__buf,(Error *)__n
                 );
    uVar2 = CONCAT71(extraout_var_00,bVar1) & 0xffffffff;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->request_mutex_);
  return uVar2;
}

Assistant:

inline bool ClientImpl::send(Request &req, Response &res, Error &error) {
  std::lock_guard<std::recursive_mutex> request_mutex_guard(request_mutex_);
  auto ret = send_(req, res, error);
  if (error == Error::SSLPeerCouldBeClosed_) {
    assert(!ret);
    ret = send_(req, res, error);
  }
  return ret;
}